

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::TransformFeedback::CheckGetXFBVarying::check
          (CheckGetXFBVarying *this,GLuint program,GLuint capture_way,GLuint shader_case,
          GLuint varying_type,GLuint number_of_attributes)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  size_t sVar6;
  GLint i;
  ulong __n;
  uint uVar7;
  uint uVar8;
  Utilities *this_00;
  bool bVar9;
  bool bVar10;
  GLenum type;
  GLsizei size;
  GLsizei length;
  GLint xfb_mode;
  GLint xfb_varyings;
  GLint xfb_varying_max_length;
  GLchar name [18];
  GLenum local_c8;
  int local_c4;
  uint local_c0;
  GLuint local_bc;
  long *local_b8;
  ulong local_b0;
  long local_a8 [2];
  long *local_98;
  ulong local_90;
  long local_88 [2];
  long local_78;
  string local_70;
  VaryingType *local_50;
  char local_48 [24];
  
  local_bc = capture_way;
  iVar4 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  local_78 = CONCAT44(extraout_var,iVar4);
  bVar9 = number_of_attributes != 0;
  if (number_of_attributes == 0) {
    uVar7 = 0;
  }
  else {
    local_50 = s_varying_types + varying_type;
    uVar7 = 0;
    this_00 = (Utilities *)0x0;
    while( true ) {
      lVar3 = local_78;
      local_c0 = 0;
      local_c4 = 0;
      local_c8 = 0;
      local_48[0] = '\0';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      (**(code **)(local_78 + 0xb18))(program,this_00,0x12,&local_c0,&local_c4,&local_c8,local_48);
      dVar5 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar5,"glGetTransformFeedbackVarying call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xe74);
      if (uVar7 <= local_c0) {
        uVar7 = local_c0;
      }
      if (local_c0 == 0) break;
      local_98 = local_88;
      sVar6 = strlen(local_48);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,local_48,local_48 + sVar6)
      ;
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"result_","");
      Utilities::itoa_abi_cxx11_(&local_70,this_00,i);
      std::__cxx11::string::_M_append
                ((char *)&local_b8,
                 CONCAT44(local_70._M_dataplus._M_p._4_4_,(uint)local_70._M_dataplus._M_p));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(uint)local_70._M_dataplus._M_p) !=
          &local_70.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_70._M_dataplus._M_p._4_4_,(uint)local_70._M_dataplus._M_p),
                        local_70.field_2._M_allocated_capacity + 1);
      }
      uVar2 = local_90;
      uVar1 = local_b0;
      __n = local_90;
      if (local_b0 < local_90) {
        __n = local_b0;
      }
      if (__n == 0) {
        bVar10 = true;
      }
      else {
        iVar4 = bcmp(local_98,local_b8,__n);
        bVar10 = iVar4 == 0;
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      if (local_98 != local_88) {
        operator_delete(local_98,local_88[0] + 1);
      }
      if ((!(bool)(bVar10 & uVar2 == uVar1 & local_c4 == 1)) || (local_c8 != local_50->type)) break;
      uVar8 = (int)this_00 + 1;
      this_00 = (Utilities *)(ulong)uVar8;
      bVar9 = uVar8 < number_of_attributes;
      if (uVar8 == number_of_attributes) break;
    }
  }
  lVar3 = local_78;
  bVar10 = false;
  if (!bVar9) {
    local_98 = (long *)((ulong)local_98 & 0xffffffff00000000);
    local_b8 = (long *)((ulong)local_b8 & 0xffffffff00000000);
    local_70._M_dataplus._M_p._0_4_ = 0;
    (**(code **)(local_78 + 0x9d8))(program,0x8c83);
    (**(code **)(lVar3 + 0x9d8))(program,0x8c7f,&local_b8);
    (**(code **)(lVar3 + 0x9d8))(program,0x8c76,&local_70);
    dVar5 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar5,"glGetProgramiv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xea1);
    bVar10 = false;
    if ((GLuint)local_98 == number_of_attributes) {
      if ((GLenum)local_b8 == s_capture_ways[local_bc]) {
        bVar10 = uVar7 <= (uint)local_70._M_dataplus._M_p;
      }
      else {
        bVar10 = false;
      }
    }
  }
  return bVar10;
}

Assistant:

bool gl3cts::TransformFeedback::CheckGetXFBVarying::check(glw::GLuint program, glw::GLuint capture_way,
														  glw::GLuint shader_case UNUSED, glw::GLuint varying_type,
														  glw::GLuint number_of_attributes)
{
	/* Functions handler */
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	glw::GLuint			  max_length = 0;

	/* Inspect glGetTransformFeedbackVarying. */
	for (glw::GLuint i = 0; i < number_of_attributes; ++i)
	{
		const glw::GLsizei bufSize  = 18;
		glw::GLsizei	   length   = 0;
		glw::GLsizei	   size		= 0;
		glw::GLenum		   type		= GL_NONE;
		glw::GLchar		   name[18] = { 0 }; /* Size of bufSize. */

		gl.getTransformFeedbackVarying(program, i, bufSize, &length, &size, &type, name);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTransformFeedbackVarying call failed.");

		max_length = deMaxu32(max_length, glw::GLuint(length));

		/* Check name. */
		if (length)
		{
			std::string varying		= name;
			std::string varying_ref = "result_";
			varying_ref.append(gl3cts::TransformFeedback::Utilities::itoa(i));

			if (0 != varying.compare(varying_ref))
			{
				return false;
			}
		}
		else
		{
			return false;
		}

		/* Check size. */
		const glw::GLuint size_ref = 1;

		if (size != size_ref)
		{
			return false;
		}

		/* Check type. */
		if (type != s_varying_types[varying_type].type)
		{
			return false;
		}
	}

	/* Inspect glGetProgramiv. */
	glw::GLint xfb_varyings			  = 0;
	glw::GLint xfb_mode				  = 0;
	glw::GLint xfb_varying_max_length = 0;

	gl.getProgramiv(program, GL_TRANSFORM_FEEDBACK_VARYINGS, &xfb_varyings);
	gl.getProgramiv(program, GL_TRANSFORM_FEEDBACK_BUFFER_MODE, &xfb_mode);
	gl.getProgramiv(program, GL_TRANSFORM_FEEDBACK_VARYING_MAX_LENGTH, &xfb_varying_max_length);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

	if (glw::GLuint(xfb_varyings) != number_of_attributes)
	{
		return false;
	}

	if (glw::GLenum(xfb_mode) != s_capture_ways[capture_way])
	{
		return false;
	}

	if (glw::GLuint(xfb_varying_max_length) < max_length)
	{
		return false;
	}

	return true;
}